

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
baryonyx::details::ap_file_observer::ap_file_observer
          (ap_file_observer *this,string_view filename,int m,int n,long param_4)

{
  allocator<char> local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = filename._M_str;
  local_20._M_len = filename._M_len;
  this->constraints = m;
  this->variables = n;
  this->m_frame = 0;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->m_basename,&local_20,&local_21);
  std::vector<float,_std::allocator<float>_>::vector
            (&this->m_value,(long)this->variables,(allocator_type *)&local_21);
  return;
}

Assistant:

ap_file_observer(const std::string_view filename,
                     int m,
                     int n,
                     long int /*loop*/)
      : constraints(m)
      , variables(n)
      , m_frame(0)
      , m_basename(std::move(filename))
      , m_value(variables)
    {}